

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.c
# Opt level: O0

void AllocateInChuck(Heap *heap,Chuck *chuck,Size size)

{
  uint8_t uVar1;
  Chuck *chuck_00;
  Chuck *pCVar2;
  Chuck *remain;
  Size size_local;
  Chuck *chuck_local;
  Heap *heap_local;
  
  MoveOut(heap,chuck);
  chuck_00 = SplitIfWorthy(chuck,size);
  if (chuck_00 != (Chuck *)0x0) {
    pCVar2 = GetHigher(chuck_00);
    uVar1 = GetUsed(pCVar2);
    if (uVar1 == '\0') {
      pCVar2 = GetHigher(chuck_00);
      MoveOut(heap,pCVar2);
      pCVar2 = GetHigher(chuck_00);
      pCVar2 = GetHigher(pCVar2);
      SetHigher(chuck_00,pCVar2);
    }
    MoveIn(heap,chuck_00);
  }
  return;
}

Assistant:

static void AllocateInChuck(Heap *heap, Chuck *chuck, Size size) {
    MoveOut(heap, chuck);
    Chuck *remain = SplitIfWorthy(chuck, size);
    if (remain) {
        if (!GetUsed(GetHigher(remain))) {
            MoveOut(heap, GetHigher(remain));
            SetHigher(remain, GetHigher(GetHigher(remain)));
        }
        MoveIn(heap, remain);
    }
}